

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slab_cache.c
# Opt level: O2

void slab_poison(slab *slab)

{
  ulong uVar1;
  ulong uVar2;
  unsigned_long _zzq_args [6];
  unsigned_long _zzq_result;
  
  uVar1 = (ulong)((long)slab << 3) >> 0x33;
  uVar2 = (((long)slab << 3 | (ulong)slab >> 0x3d) << 0xd | uVar1) >> 3;
  memset(slab + 1,0x50,*(long *)((uVar2 << 0x33 | (uVar1 << 0x3d | uVar2) >> 0xd) + 0x20) - 0x30);
  return;
}

Assistant:

static inline void
slab_poison(struct slab *slab)
{
	(void)slab;
#ifndef NDEBUG
	VALGRIND_MAKE_MEM_UNDEFINED(slab_data(slab), slab_capacity(slab));
	const char poison_char = 'P';
	memset(slab_data(slab), poison_char, slab_capacity(slab));
#endif
	VALGRIND_MAKE_MEM_NOACCESS(slab_data(slab), slab_capacity(slab));
}